

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O1

QTextHtmlParserNode * __thiscall QTextHtmlParser::newNode(QTextHtmlParser *this,int parent)

{
  char16_t cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  QTextHtmlParserNode *pQVar5;
  QArrayData *pQVar6;
  char cVar7;
  iterator iVar8;
  QTextHtmlParserNode *pQVar9;
  wchar32 wVar10;
  int iVar11;
  long in_FS_OFFSET;
  QTextHtmlParserNode *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
  lVar3 = (this->nodes).d.size;
  if ((lVar3 != 1) && (pQVar9 = iVar8.i[-1], (pQVar9->tag).d.size == 0)) {
    lVar4 = (pQVar9->text).d.size;
    if (lVar4 == 0) {
LAB_0051a2ea:
      if ((pQVar9->tag).d.ptr != (char16_t *)0x0) {
        pQVar6 = &((pQVar9->tag).d.d)->super_QArrayData;
        (pQVar9->tag).d.d = (Data *)0x0;
        (pQVar9->tag).d.ptr = (char16_t *)0x0;
        (pQVar9->tag).d.size = 0;
        if (pQVar6 != (QArrayData *)0x0) {
          LOCK();
          (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar6,2,0x10);
          }
        }
      }
      if ((pQVar9->text).d.ptr != (char16_t *)0x0) {
        pQVar6 = &((pQVar9->text).d.d)->super_QArrayData;
        (pQVar9->text).d.d = (Data *)0x0;
        (pQVar9->text).d.ptr = (char16_t *)0x0;
        (pQVar9->text).d.size = 0;
        if (pQVar6 != (QArrayData *)0x0) {
          LOCK();
          (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar6,2,0x10);
          }
        }
      }
      pQVar9->id = Html_unknown;
      goto LAB_0051a24f;
    }
    if ((lVar4 == 1) &&
       (((cVar1 = *(pQVar9->text).d.ptr, (ushort)cVar1 - 9 < 5 || (cVar1 == L' ')) ||
        ((0x7f < (ushort)cVar1 &&
         (((wVar10 = (wchar32)(ushort)cVar1, wVar10 == L'\x85' || (wVar10 == L'\xa0')) ||
          (cVar7 = QChar::isSpace_helper(wVar10), cVar7 != '\0')))))))) {
      iVar2 = (int)lVar3 + -2;
      while (iVar11 = iVar2, iVar11 != 0) {
        pQVar5 = (this->nodes).d.ptr[iVar11];
        iVar2 = pQVar5->parent;
        if ((iVar2 == pQVar9->parent) || ((*(ushort *)&pQVar5->field_0x90 & 0xe00) != 0x200)) break;
      }
      if ((*(ushort *)&(this->nodes).d.ptr[iVar11]->field_0x90 & 0xe00) != 0x200) goto LAB_0051a2ea;
    }
  }
  pQVar9 = (QTextHtmlParserNode *)operator_new(0x1e0);
  QTextHtmlParserNode::QTextHtmlParserNode(pQVar9);
  local_30 = pQVar9;
  QtPrivate::QPodArrayOps<QTextHtmlParserNode*>::emplace<QTextHtmlParserNode*&>
            ((QPodArrayOps<QTextHtmlParserNode*> *)this,(this->nodes).d.size,&local_30);
  QList<QTextHtmlParserNode_*>::end(&this->nodes);
  iVar8 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
  pQVar9 = iVar8.i[-1];
LAB_0051a24f:
  pQVar9->parent = parent;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return pQVar9;
}

Assistant:

QTextHtmlParserNode *QTextHtmlParser::newNode(int parent)
{
    QTextHtmlParserNode *lastNode = nodes.last();
    QTextHtmlParserNode *newNode = nullptr;

    bool reuseLastNode = true;

    if (nodes.size() == 1) {
        reuseLastNode = false;
    } else if (lastNode->tag.isEmpty()) {

        if (lastNode->text.isEmpty()) {
            reuseLastNode = true;
        } else { // last node is a text node (empty tag) with some text

            if (lastNode->text.size() == 1 && lastNode->text.at(0).isSpace()) {

                int lastSibling = count() - 2;
                while (lastSibling
                       && at(lastSibling).parent != lastNode->parent
                       && at(lastSibling).displayMode == QTextHtmlElement::DisplayInline) {
                    lastSibling = at(lastSibling).parent;
                }

                if (at(lastSibling).displayMode == QTextHtmlElement::DisplayInline) {
                    reuseLastNode = false;
                } else {
                    reuseLastNode = true;
                }
            } else {
                // text node with real (non-whitespace) text -> nothing to re-use
                reuseLastNode = false;
            }

        }

    } else {
        // last node had a proper tag -> nothing to re-use
        reuseLastNode = false;
    }

    if (reuseLastNode) {
        newNode = lastNode;
        newNode->tag.clear();
        newNode->text.clear();
        newNode->id = Html_unknown;
    } else {
        nodes.append(new QTextHtmlParserNode);
        newNode = nodes.last();
    }

    newNode->parent = parent;
    return newNode;
}